

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_unitvect_unpack_adaptproj(double *in,double *out)

{
  double dVar1;
  double dVar2;
  
  dVar1 = in[1];
  if (1.0 < ABS(*in)) {
    out[1] = dVar1;
    dVar1 = 1.0 / *in;
    out[2] = dVar1;
    dVar1 = 1.0 - (in[1] * in[1] + dVar1 * dVar1);
    if (dVar1 <= 0.0) {
      dVar1 = 0.0;
    }
    *out = SQRT(dVar1) * in[2];
    return;
  }
  *out = *in;
  dVar2 = in[1];
  if (1.0 < ABS(dVar1)) {
    dVar2 = 1.0 / dVar2;
    out[2] = dVar2;
    dVar1 = 1.0 - (*in * *in + dVar2 * dVar2);
    if (dVar1 <= 0.0) {
      dVar1 = 0.0;
    }
    out[1] = SQRT(dVar1) * in[2];
    return;
  }
  out[1] = dVar2;
  dVar1 = 1.0 - (*in * *in + dVar2 * dVar2);
  if (dVar1 <= 0.0) {
    dVar1 = 0.0;
  }
  out[2] = SQRT(dVar1) * in[2];
  return;
}

Assistant:

MCPL_LOCAL void mcpl_unitvect_unpack_adaptproj( const double* in, double* out ) {

  //Unpacking for the "Adaptive Projection Packing" method (T. Kittelmann, 2017).
  //See mcpl_unitvect_pack_adaptproj for more information.
  //
  //Note that the arrays "in" and "out" are both of dimension 3, however in[2]
  //will contain only binary information, in the form of the sign of the
  //component which was projected away.

  assert(in[2]==1.0||in[2]==-1.0);
  if (fabs(in[0]) > 1.0) {
    //input is (1/z,y,sign(x))
    out[1] = in[1]; out[2] = 1.0 / in[0];
    out[0] = in[2] * sqrt( fmax( 0.0, 1.0 - ( in[1]*in[1] + out[2]*out[2] ) ) );
  } else if (fabs(in[1])>1.0) {
    //input is (x,1/z,sign(y))
    out[0] = in[0]; out[2] = 1.0 / in[1];
    out[1] = in[2] * sqrt( fmax ( 0.0, 1.0 - ( in[0]*in[0] + out[2]*out[2] ) ) );
  } else {
    //input is (x,y,sign(z))
    out[0] = in[0]; out[1] = in[1];
    out[2] = in[2] * sqrt( fmax( 0.0, 1.0 - ( in[0]*in[0] + in[1]*in[1] ) ) );
  }
}